

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  BigAttr *pBVar4;
  BigAttr *pBVar5;
  BigAttr *attr;
  int i;
  BigAttr *attrs;
  size_t nattr;
  char **ppcStack_18;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&stack0xffffffffffffffe8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
  MPI_Type_contiguous(2,&ompi_mpi_long,&MPI_TYPE_WORK);
  MPI_Type_commit(&MPI_TYPE_WORK);
  while (nattr._4_4_ = getopt((int)argv_local,ppcStack_18,"n:N:vb:f:"), nattr._4_4_ != -1) {
    switch(nattr._4_4_) {
    case 0x4e:
    case 0x6e:
      Nfile = atoi(_optarg);
      break;
    default:
      usage();
      break;
    case 0x62:
      __isoc99_sscanf(_optarg,"%td",&buffersize);
      break;
    case 0x66:
      newfilepath = _optarg;
      break;
    case 0x76:
      verbose = 1;
    }
  }
  if ((int)argv_local - _optind != 3) {
    usage();
  }
  ppcStack_18 = ppcStack_18 + (_optind + -1);
  iVar2 = big_file_mpi_open(&bf,ppcStack_18[1],(MPI_Comm)&ompi_mpi_comm_world);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    fprintf(pFVar1,"failed to open: %s\n",pcVar3);
    exit(1);
  }
  iVar2 = big_file_mpi_open_block(&bf,&bb,ppcStack_18[2],(MPI_Comm)&ompi_mpi_comm_world);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    fprintf(pFVar1,"failed to open: %s\n",pcVar3);
    exit(1);
  }
  if ((Nfile == -1) || (bb.Nfile == 0)) {
    Nfile = bb.Nfile;
  }
  if (newfilepath == (char *)0x0) {
    newfilepath = ppcStack_18[1];
  }
  iVar2 = big_file_mpi_create(&bfnew,newfilepath,(MPI_Comm)&ompi_mpi_comm_world);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    fprintf(pFVar1,"failed to open: %s\n",pcVar3);
    exit(1);
  }
  iVar2 = big_file_mpi_create_block
                    (&bfnew,&bbnew,ppcStack_18[3],bb.dtype,bb.nmemb,Nfile,bb.size,
                     (MPI_Comm)&ompi_mpi_comm_world);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    fprintf(pFVar1,"failed to create temp: %s\n",pcVar3);
    exit(1);
  }
  if (bbnew.size != bb.size) {
    abort();
  }
  pBVar4 = big_block_list_attrs(&bb,(size_t *)&attrs);
  for (attr._4_4_ = 0; (BigAttr *)(long)attr._4_4_ < attrs; attr._4_4_ = attr._4_4_ + 1) {
    pBVar5 = pBVar4 + attr._4_4_;
    big_block_set_attr(&bbnew,pBVar5->name,pBVar5->data,pBVar5->dtype,pBVar5->nmemb);
  }
  if ((0 < bb.nmemb) && (bb.size != 0)) {
    if (ThisTask == 0) {
      server();
    }
    else {
      slave();
    }
  }
  iVar2 = big_block_mpi_close(&bbnew,(MPI_Comm)&ompi_mpi_comm_world);
  pFVar1 = _stderr;
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    fprintf(pFVar1,"failed to close new: %s\n",pcVar3);
    exit(1);
  }
  big_block_mpi_close(&bb,(MPI_Comm)&ompi_mpi_comm_world);
  big_file_mpi_close(&bf,(MPI_Comm)&ompi_mpi_comm_world);
  big_file_mpi_close(&bfnew,(MPI_Comm)&ompi_mpi_comm_world);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {

    MPI_Init(&argc, &argv);

    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);

    MPI_Type_contiguous(2, MPI_LONG, &MPI_TYPE_WORK);
    MPI_Type_commit(&MPI_TYPE_WORK);

    int ch;
    while(-1 != (ch = getopt(argc, argv, "n:N:vb:f:"))) {
        switch(ch) {
            case 'N':
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'b':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'f':
                newfilepath = optarg;
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_mpi_open(&bf, argv[1], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_open_block(&bf, &bb, argv[2], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    if(newfilepath == NULL) {
        newfilepath = argv[1];
    }
    if(0 != big_file_mpi_create(&bfnew, newfilepath, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, bb.size, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    int i;
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }

    if(bb.nmemb > 0 && bb.size > 0) {
    /* copy data */
        if(ThisTask == 0) {
            server();
        } else {
            slave();
        }
    }
    if(0 != big_block_mpi_close(&bbnew, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_mpi_close(&bb, MPI_COMM_WORLD);
    big_file_mpi_close(&bf, MPI_COMM_WORLD);
    big_file_mpi_close(&bfnew, MPI_COMM_WORLD);
    return 0;
}